

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

longlong kj::anon_unknown_39::parseSigned(StringPtr *s,longlong min,longlong max)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  char *s_00;
  int __base;
  bool local_81;
  Fault local_70;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  longlong value;
  char *endPtr;
  Fault local_38;
  Fault f;
  longlong max_local;
  longlong min_local;
  StringPtr *s_local;
  
  f.exception = (Exception *)max;
  max_local = min;
  min_local = (longlong)s;
  bVar1 = StringPtr::operator!=(s,(void *)0x0);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = StringPtr::begin((StringPtr *)min_local);
    s_00 = StringPtr::cStr((StringPtr *)min_local);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    f_1.exception = (Exception *)strtoll(pcVar3,(char **)&value,__base);
    pcVar3 = StringPtr::end((StringPtr *)min_local);
    if ((char *)value == pcVar3) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x22) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::StringPtr_const&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                   ,0x31,FAILED,"errno != ERANGE","\"Value out-of-range\", s",
                   (char (*) [19])"Value out-of-range",(StringPtr *)min_local);
        s_local = (StringPtr *)0x0;
        _::Debug::Fault::~Fault(&f_3);
      }
      else {
        local_81 = (long)f_1.exception < max_local || (long)f.exception < (long)f_1.exception;
        if (local_81) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[19],long_long&,long_long&,long_long&>
                    (&local_70,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                     ,0x32,FAILED,"value >= min && value <= max",
                     "\"Value out-of-range\", value, min, max",(char (*) [19])"Value out-of-range",
                     (longlong *)&f_1,&max_local,(longlong *)&f);
          s_local = (StringPtr *)0x0;
          _::Debug::Fault::~Fault(&local_70);
        }
        else {
          s_local = (StringPtr *)f_1.exception;
        }
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                 ,0x30,FAILED,"endPtr == s.end()","\"String does not contain valid number\", s",
                 (char (*) [37])"String does not contain valid number",(StringPtr *)min_local);
      s_local = (StringPtr *)0x0;
      _::Debug::Fault::~Fault(&f_2);
    }
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
               ,0x2c,FAILED,"s != nullptr","\"String does not contain valid number\", s",
               (char (*) [37])"String does not contain valid number",(StringPtr *)min_local);
    s_local = (StringPtr *)0x0;
    _::Debug::Fault::~Fault(&local_38);
  }
  return (longlong)s_local;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}